

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void ui::Loop(void)

{
  vector<int,_std::allocator<int>_> *this;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  *this_01;
  _Impl *this_02;
  __shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2> *this_03;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pvVar3;
  pointer piVar4;
  Group *pGVar5;
  undefined8 uVar6;
  pointer psVar7;
  pointer pGVar8;
  int *selector;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pGVar10;
  pointer p_Var11;
  _Impl *this_04;
  size_type __new_size;
  pointer p_Var12;
  undefined8 uVar13;
  pointer *ppsVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_05;
  ulong uVar15;
  __shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2> *p_Var16;
  long lVar17;
  Ref<ftxui::ButtonOption> option;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l_00;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l_01;
  ConstStringListRef entries;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_02;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_03;
  pointer local_778;
  __allocator_type __a2;
  undefined1 local_760 [16];
  undefined1 local_750 [24];
  pointer psStack_738;
  ComponentBase *local_730;
  Component left_container;
  undefined1 local_708 [16];
  _Manager_type local_6f8;
  _Invoker_type p_Stack_6f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_6e0;
  Group *local_6d8;
  undefined1 local_6d0 [16];
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_6c0;
  Color local_6b0;
  Color local_6ac;
  Color local_6a8;
  Color local_6a4;
  Color local_6a0;
  Color local_69c;
  vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_> groups
  ;
  vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  local_668;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_650;
  shared_ptr<ui::PanelBase> it;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_628;
  Component menu_renderer;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_600;
  undefined1 local_5e8 [16];
  code *local_5d8;
  code *local_5d0;
  Component local_5c8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *local_5b0;
  int *local_5a8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *local_5a0;
  int *local_598;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *local_590;
  long local_588;
  long local_580;
  __shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2> *local_578;
  long local_570;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ui::(anonymous_namespace)::MainMenu,_std::allocator<ui::(anonymous_namespace)::MainMenu>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_568;
  Component content_renderer;
  code *local_548 [2];
  code *local_538;
  code *local_530;
  code *local_528 [2];
  code *local_518;
  code *local_510;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_508;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_4f8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_4e8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_4d8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_4c8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_4b8;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_4a8;
  Decorator local_488;
  Decorator local_468;
  Decorator local_448;
  Decorator local_428;
  undefined8 local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_400;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_3f8;
  Decorator local_3e8;
  Decorator local_3c8;
  Decorator local_3a8;
  Decorator local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [88];
  vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_> local_2f0
  ;
  string local_2d8 [32];
  vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
  local_2b8 [3];
  MenuOption menu_option;
  MenuOption local_1a0;
  ScreenInteractive screen;
  
  ftxui::ScreenInteractive::Fullscreen();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"System",(allocator<char> *)local_708);
  panel::PRU();
  panel::GPIO();
  panel::EMMC();
  panel::Led();
  panel::passwd();
  panel::ssh();
  __l._M_len = 6;
  __l._M_array = (iterator)&menu_option;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector((vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_> *
         )(local_348 + 0x20),__l,(allocator_type *)&local_428);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_348 + 0x38),"Network",(allocator<char> *)local_548);
  panel::WiFi((panel *)&local_1a0,&screen);
  panel::ICS();
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_1a0;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector(&local_2f0,__l_00,(allocator_type *)&local_448);
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"Info",(allocator<char> *)&local_468)
  ;
  panel::About();
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_760;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector(local_2b8,__l_01,(allocator_type *)&local_488);
  groups.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  groups.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  groups.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar10 = (pointer)operator_new(0xa8);
  groups.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pGVar10 + 3;
  groups.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_start = pGVar10;
  for (lVar17 = 0; pGVar5 = (Group *)((long)&(pGVar10->title)._M_dataplus._M_p + lVar17),
      lVar17 != 0xa8; lVar17 = lVar17 + 0x38) {
    std::_Construct<ui::(anonymous_namespace)::Group,ui::(anonymous_namespace)::Group_const&>
              (pGVar5,(Group *)(local_348 + lVar17));
  }
  lVar17 = 0x70;
  groups.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar5;
  do {
    anon_unknown_1::Group::~Group((Group *)(local_348 + lVar17));
    lVar17 = lVar17 + -0x38;
  } while (lVar17 != -0x38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_760 + 8));
  lVar17 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_1a0.style_normal.super__Function_base._M_functor + lVar17));
    lVar17 = lVar17 + -0x10;
  } while (lVar17 != -8);
  lVar17 = 0x58;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&menu_option.style_normal.super__Function_base._M_functor + lVar17));
    lVar17 = lVar17 + -0x10;
  } while (lVar17 != -8);
  local_408 = 0;
  p_Var11 = (pointer)operator_new(0xf0);
  pGVar8 = groups.
           super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pGVar10 = groups.
            super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_568._M_alloc = &__a2;
  (p_Var11->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var11->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var11->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00167c40;
  this_05 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)groups.
                   super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)groups.
                  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  local_568._M_ptr = p_Var11;
  if (this_05 == (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_778 = (pointer)0x0;
  }
  else {
    if (0x249249249249249 < (ulong)((long)this_05 / 0x38)) {
      uVar13 = std::__throw_bad_array_new_length();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_508._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_05);
      std::
      vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>::
      ~vector(&groups);
      ftxui::ScreenInteractive::~ScreenInteractive(&screen);
      _Unwind_Resume(uVar13);
    }
    local_778 = (pointer)operator_new((ulong)this_05);
  }
  this_04 = &p_Var11->_M_impl;
  local_668.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((long)&this_05->_M_pi + (long)local_778);
  lVar17 = 0;
  local_668.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_start = local_778;
  local_668.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_778;
  while( true ) {
    pGVar5 = (Group *)((long)&(pGVar10->title)._M_dataplus._M_p + lVar17);
    local_6d8 = (Group *)((long)&(local_778->title)._M_dataplus._M_p + lVar17);
    if (pGVar5 == pGVar8) break;
    std::_Construct<ui::(anonymous_namespace)::Group,ui::(anonymous_namespace)::Group_const&>
              (local_6d8,pGVar5);
    lVar17 = lVar17 + 0x38;
  }
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x18) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var11->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__MainMenu_00167c90;
  this = (vector<int,_std::allocator<int>_> *)
         ((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x28);
  this_00 = (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x40);
  this_01 = (vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x58);
  local_730 = (ComponentBase *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x70);
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x28) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x30) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x38) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x40) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x48) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x50) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x58) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x60) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x68) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x70) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x78) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x80) = 0;
  *(undefined4 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x88) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x90) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x98) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xa0) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xa8) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xb0) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xb8) = 0;
  *(undefined4 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xc0) = 0x23;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 200) = 0;
  *(undefined8 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xd0) = 0;
  *(undefined4 *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xd8) = 0;
  __new_size = lVar17 / 0x38;
  local_6e0 = &local_4d8._M_refcount;
  local_668.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_6d8;
  std::vector<int,_std::allocator<int>_>::resize(this,__new_size);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize(this_00,__new_size);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::resize(this_01,__new_size);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::resize((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)local_730,__new_size);
  ftxui::MenuOption::MenuOption(&menu_option);
  local_548[1] = (code *)0x0;
  local_548[0] = ftxui::bold;
  local_530 = std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
              ::_M_invoke;
  local_538 = std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
              ::_M_manager;
  ftxui::Color::Color(&local_69c,Chartreuse1);
  ftxui::color(local_69c);
  ftxui::operator|(&local_428,(Decorator *)local_548,&local_448);
  ftxui::Color::Color(&local_6a0,Black);
  ftxui::bgcolor(local_6a0);
  ftxui::operator|((Decorator *)local_348,&local_428,&local_468);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::operator=
            (&menu_option.style_selected,
             (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)local_348);
  std::_Function_base::~_Function_base((_Function_base *)local_348);
  std::_Function_base::~_Function_base(&local_468.super__Function_base);
  std::_Function_base::~_Function_base(&local_428.super__Function_base);
  std::_Function_base::~_Function_base(&local_448.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)local_548);
  ftxui::Color::Color(&local_6a4,Black);
  ftxui::color(local_6a4);
  ftxui::Color::Color(&local_6a8,Chartreuse1);
  ftxui::bgcolor(local_6a8);
  ftxui::operator|((Decorator *)local_348,&local_488,&local_388);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::operator=
            (&menu_option.style_focused,
             (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)local_348);
  std::_Function_base::~_Function_base((_Function_base *)local_348);
  std::_Function_base::~_Function_base(&local_388.super__Function_base);
  std::_Function_base::~_Function_base(&local_488.super__Function_base);
  local_528[1] = (code *)0x0;
  local_528[0] = ftxui::bold;
  local_510 = std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
              ::_M_invoke;
  local_518 = std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
              ::_M_manager;
  ftxui::Color::Color(&local_6ac,Black);
  ftxui::color(local_6ac);
  ftxui::operator|(&local_3a8,(Decorator *)local_528,&local_3c8);
  ftxui::Color::Color(&local_6b0,Chartreuse1);
  ftxui::bgcolor(local_6b0);
  ftxui::operator|((Decorator *)local_348,&local_3a8,&local_3e8);
  local_598 = (int *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x88);
  local_590 = (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0x90);
  p_Var2 = (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xa0);
  local_5a0 = (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xb0);
  local_5a8 = (int *)((long)&(p_Var11->_M_impl)._M_storage._M_storage + 0xc0);
  local_5b0 = (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(p_Var11->_M_impl)._M_storage._M_storage + 200);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::operator=
            (&menu_option.style_selected_focused,
             (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)local_348);
  std::_Function_base::~_Function_base((_Function_base *)local_348);
  std::_Function_base::~_Function_base(&local_3e8.super__Function_base);
  std::_Function_base::~_Function_base(&local_3a8.super__Function_base);
  std::_Function_base::~_Function_base(&local_3c8.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)local_528);
  uVar15 = 0;
  pGVar10 = local_6d8;
  while( true ) {
    if ((ulong)(((long)pGVar10 - (long)local_778) / 0x38) <= uVar15) break;
    local_580 = uVar15 * 0x18;
    pvVar3 = (this_00->
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    ftxui::MenuOption::MenuOption(&local_1a0,&menu_option);
    ftxui::Ref<ftxui::MenuOption>::Ref((Ref<ftxui::MenuOption> *)local_348,&local_1a0);
    entries.ref_wide_ =
         (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *)0x0;
    entries.ref_ = pvVar3 + uVar15;
    ftxui::Menu((ftxui *)local_760,entries,piVar4 + uVar15,(Ref<ftxui::MenuOption> *)local_348);
    std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this_01->
                super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar15].
                super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_760 + 8));
    ftxui::MenuOption::~MenuOption((MenuOption *)local_348);
    ftxui::MenuOption::~MenuOption(&local_1a0);
    local_4a8.
    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4a8.
    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4a8.
    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ftxui::Container::Tab
              ((Container *)local_760,&local_4a8,
               (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start + uVar15);
    local_570 = uVar15 * 0x10;
    std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((_Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                   *)&local_730->_vptr_ComponentBase)->_M_impl).super__Vector_impl_data._M_start
                [uVar15].super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_760 + 8));
    std::
    vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
    ::~vector(&local_4a8);
    (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [uVar15] = 0;
    local_588 = uVar15 * 0x38;
    p_Var16 = &(local_778[uVar15].groups.
                super__Vector_base<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>;
    local_578 = &(local_778[uVar15].groups.
                  super__Vector_base<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>;
    while( true ) {
      lVar17 = local_570;
      if (p_Var16 == local_578) break;
      std::__shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&it.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>,p_Var16);
      pvVar3 = (this_00->
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      (*((it.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ComponentBase)._vptr_ComponentBase[7])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 ((long)&(pvVar3->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_580),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760);
      std::__cxx11::string::~string((string *)local_760);
      pGVar5 = *(Group **)
                ((long)&(((((_Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                             *)&local_730->_vptr_ComponentBase)->_M_impl).super__Vector_impl_data.
                         _M_start)->
                        super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                + lVar17);
      left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var12 = (pointer)operator_new(0x58);
      local_628.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &content_renderer;
      (p_Var12->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var12->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var12->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00167cf0;
      this_02 = &p_Var12->_M_impl;
      local_6d8 = pGVar5;
      local_628.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var12;
      std::__shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2> *)&local_600,
                 &it.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>);
      *(undefined8 *)((long)&(p_Var12->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var12->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined8 *)((long)&(p_Var12->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined8 *)((long)&(p_Var12->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var12->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR__PanelAdapter_00167d40;
      *(undefined8 *)((long)&(p_Var12->_M_impl)._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)((long)&(p_Var12->_M_impl)._M_storage._M_storage + 0x30) = 0;
      this_03 = (__shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(p_Var12->_M_impl)._M_storage._M_storage + 0x38);
      std::__shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (this_03,(__shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2> *)&local_600);
      local_760._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_750._8_8_ =
           std::
           _Function_handler<std::shared_ptr<ftxui::Node>_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:19:23)>
           ::_M_invoke;
      local_750._0_8_ =
           std::
           _Function_handler<std::shared_ptr<ftxui::Node>_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:19:23)>
           ::_M_manager;
      local_760._0_8_ = this_02;
      ftxui::Renderer((ftxui *)local_708,(function<std::shared_ptr<ftxui::Node>_(bool)> *)local_760)
      ;
      p_Var1 = (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(p_Var12->_M_impl)._M_storage._M_storage + 0x28);
      std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var1,(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_708)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_708 + 8));
      std::_Function_base::~_Function_base((_Function_base *)local_760);
      std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_708,p_Var1)
      ;
      std::__shared_ptr<ftxui::ComponentBase,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<ui::PanelBase,void>
                ((__shared_ptr<ftxui::ComponentBase,(__gnu_cxx::_Lock_policy)2> *)&local_6f8,this_03
                );
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)local_708;
      std::
      vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ::vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                *)local_6d0,__l_02,(allocator_type *)&menu_renderer);
      ftxui::Container::Vertical
                ((Container *)local_5e8,
                 (vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                  *)local_6d0);
      ftxui::ComponentBase::Add((ComponentBase *)this_02,(Component *)local_5e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5e8 + 8));
      std::
      vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ::~vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                 *)local_6d0);
      lVar17 = 0x18;
      do {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_708 + lVar17));
        lVar17 = lVar17 + -0x10;
      } while (lVar17 != -8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_600.
                  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      local_628.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this_02;
      left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var12;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ui::(anonymous_namespace)::PanelAdapter,_std::allocator<ui::(anonymous_namespace)::PanelAdapter>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ui::(anonymous_namespace)::PanelAdapter,_std::allocator<ui::(anonymous_namespace)::PanelAdapter>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_628);
      local_5c8.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_5c8.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ftxui::ComponentBase::Add((ComponentBase *)local_6d8,&local_5c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_5c8.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&left_container.
                  super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&it.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      p_Var16 = p_Var16 + 1;
    }
    local_778 = local_668.
                super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string
              ((string *)&local_368,
               (string *)
               ((long)&((local_668.
                         super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                         ._M_impl.super__Vector_impl_data._M_start)->title)._M_dataplus._M_p +
               local_588));
    std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_4b8,
               (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this_01->
                         super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               + lVar17));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760,
                   anon_var_dwarf_ca21c,&local_368);
    std::__cxx11::string::operator=((string *)&local_368,(string *)local_760);
    std::__cxx11::string::~string((string *)local_760);
    std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_6d0,
               &local_4b8);
    std::__cxx11::string::string((string *)local_760,(string *)&local_368);
    std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)(local_750 + 0x10),
               &local_4b8);
    local_6f8 = (_Manager_type)0x0;
    p_Stack_6f0 = (_Invoker_type)0x0;
    local_708._0_8_ = (element_type *)0x0;
    local_708._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_708._0_8_ = operator_new(0x30);
    psVar7 = psStack_738;
    uVar6 = local_750._16_8_;
    uVar13 = local_760._8_8_;
    ppsVar14 = &(((element_type *)local_708._0_8_)->children_).
                super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    ((element_type *)local_708._0_8_)->_vptr_ComponentBase = (_func_int **)ppsVar14;
    if ((element_type *)local_760._0_8_ == (element_type *)local_750) {
      *ppsVar14 = (pointer)local_750._0_8_;
      (((element_type *)local_708._0_8_)->children_).
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_750._8_8_;
    }
    else {
      ((element_type *)local_708._0_8_)->_vptr_ComponentBase = (_func_int **)local_760._0_8_;
      (((element_type *)local_708._0_8_)->children_).
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_750._0_8_;
    }
    local_760._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_750._0_8_ = local_750._0_8_ & 0xffffffffffffff00;
    psStack_738 = (pointer)0x0;
    (((element_type *)local_708._0_8_)->children_).
    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar13;
    local_750._16_8_ = (ComponentBase *)0x0;
    ((element_type *)local_708._0_8_)->parent_ = (ComponentBase *)uVar6;
    ((element_type *)(local_708._0_8_ + 0x28))->_vptr_ComponentBase = (_func_int **)psVar7;
    p_Stack_6f0 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:49:25)>
                  ::_M_invoke;
    local_6f8 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:49:25)>
                ::_M_manager;
    local_760._0_8_ = (element_type *)local_750;
    ftxui::Renderer((ftxui *)local_5e8,(Component *)local_6d0,
                    (function<std::shared_ptr<ftxui::Node>_()> *)local_708);
    std::_Function_base::~_Function_base((_Function_base *)local_708);
    (anonymous_namespace)::Header(std::__cxx11::string,std::shared_ptr<ftxui::ComponentBase>)::$_0::
    ~__0((__0 *)local_760);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d0 + 8));
    std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this_01->
                         super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               + lVar17),(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_5e8
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5e8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4b8._M_refcount);
    std::__cxx11::string::~string((string *)&local_368);
    uVar15 = uVar15 + 1;
    pGVar10 = local_668.
              super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_600,this_01);
  selector = local_598;
  ftxui::Container::Vertical((Container *)local_760,&local_600,local_598);
  p_Var9 = local_590;
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (local_590,(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_760 + 8));
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_600);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_628,
           (vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)local_730);
  ftxui::Container::Tab((Container *)local_760,&local_628,selector);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_760 + 8));
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_628);
  ftxui::ConstStringRef::ConstStringRef((ConstStringRef *)local_760,"[Exit]");
  ftxui::ScreenInteractive::ExitLoopClosure(&screen);
  option.address_ = (ButtonOption *)0x0;
  option._0_8_ = local_708;
  ftxui::Button((ConstStringRef *)local_6d0,(function<void_()> *)local_760,option);
  p_Var1 = local_5a0;
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (local_5a0,(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_6d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d0 + 8));
  std::_Function_base::~_Function_base((_Function_base *)local_708);
  std::__cxx11::string::~string((string *)local_760);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_6d0,p_Var1);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_6c0,p_Var9);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_6d0;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)&it,__l_03,(allocator_type *)local_5e8);
  ftxui::Container::Vertical((Container *)&left_container,(Components *)&it);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             *)&it);
  lVar17 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d0 + lVar17));
    lVar17 = lVar17 + -0x10;
  } while (lVar17 != -8);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4c8,
             &left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  local_6d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6c0._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:108:51)>
       ::_M_invoke;
  local_6c0._M_ptr =
       (element_type *)
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:108:51)>
       ::_M_manager;
  local_6d0._0_8_ = this_04;
  ftxui::Renderer((ftxui *)&menu_renderer,(Component *)&local_4c8,
                  (function<std::shared_ptr<ftxui::Node>_()> *)local_6d0);
  std::_Function_base::~_Function_base((_Function_base *)local_6d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4c8._M_refcount);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4d8,p_Var2);
  local_5e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5d0 = std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:121:30)>
              ::_M_invoke;
  local_5d8 = std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:121:30)>
              ::_M_manager;
  local_5e8._0_8_ = this_04;
  ftxui::Renderer((ftxui *)&content_renderer,(Component *)&local_4d8,
                  (function<std::shared_ptr<ftxui::Node>_()> *)local_5e8);
  std::_Function_base::~_Function_base((_Function_base *)local_5e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d8._M_refcount);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4e8,
             &menu_renderer.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4f8,
             &content_renderer.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ftxui::ResizableSplitLeft
            ((ftxui *)&local_650,(Component *)&local_4e8,(Component *)&local_4f8,local_5a8);
  p_Var2 = local_5b0;
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (local_5b0,&local_650);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_650._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4f8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e8._M_refcount);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_650,p_Var2);
  ftxui::ComponentBase::Add((ComponentBase *)this_04,(Component *)&local_650);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_650._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&content_renderer.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&menu_renderer.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&left_container.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ftxui::MenuOption::~MenuOption(&menu_option);
  std::vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>::
  ~vector(&local_668);
  local_568._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ui::(anonymous_namespace)::MainMenu,_std::allocator<ui::(anonymous_namespace)::MainMenu>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_568);
  local_408 = 0;
  _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3f8._M_ptr = (element_type *)this_04;
  local_3f8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_400);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_508,&local_3f8);
  ftxui::ScreenInteractive::Loop(&screen,(Component *)&local_508);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_508._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f8._M_refcount);
  std::vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>::
  ~vector(&groups);
  ftxui::ScreenInteractive::~ScreenInteractive(&screen);
  return;
}

Assistant:

void Loop() {
  auto screen = ScreenInteractive::Fullscreen();
  std::vector<Group> groups = {
      {"System",
       {
           panel::PRU(), panel::GPIO(), panel::EMMC(), panel::Led(),
           panel::passwd(), panel::ssh(),
           // TODO: panel::PlaceHolder("Sensor Stats and Configurations "),
           // TODO: panel::PlaceHolder("Firmware Update"),
           // TODO: panel::PlaceHolder("SSH"),
       }},
      {"Network",
       {
           panel::WiFi(&screen),
           panel::ICS(),
       }},
      {"Info",
       {
           // TODO: panel::PlaceHolder("Update"),
           panel::About(),
       }},
  };

  Component main_menu = Make<MainMenu>(std::move(groups), &screen);
  screen.Loop(main_menu);
}